

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O2

Data * __thiscall
QTzTimeZonePrivate::data
          (Data *__return_storage_ptr__,QTzTimeZonePrivate *this,qint64 forMSecsSinceEpoch)

{
  QTzTransitionRule *pQVar1;
  long lVar2;
  QTzTransitionTime *pQVar3;
  QTzTransitionRule *pQVar4;
  QTzTransitionTime *pQVar5;
  undefined4 uVar6;
  undefined1 *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  Data *pDVar10;
  ulong uVar11;
  undefined1 *puVar12;
  long in_FS_OFFSET;
  QTzTransitionRule rule;
  QArrayDataPointer<QTimeZonePrivate::Data> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->cached_data).m_posixRule.d.size == 0) ||
     ((lVar2 = (this->cached_data).m_tranTimes.d.size, lVar2 != 0 &&
      (forMSecsSinceEpoch <= (this->cached_data).m_tranTimes.d.ptr[lVar2 + -1].atMSecsSinceEpoch))))
  {
LAB_003b379d:
    uVar11 = (this->cached_data).m_tranTimes.d.size;
    if (uVar11 == 0) {
      (__return_storage_ptr__->abbreviation).d.d = (Data *)0x0;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->abbreviation).d.size = 0;
      __return_storage_ptr__->atMSecsSinceEpoch = -0x8000000000000000;
      __return_storage_ptr__->offsetFromUtc = -0x80000000;
      __return_storage_ptr__->standardTimeOffset = -0x80000000;
      __return_storage_ptr__->daylightTimeOffset = -0x80000000;
    }
    else {
      pQVar3 = (this->cached_data).m_tranTimes.d.ptr;
      pQVar5 = pQVar3;
      while (uVar8 = uVar11, 0 < (long)uVar8) {
        uVar11 = uVar8 >> 1;
        if (pQVar5[uVar11].atMSecsSinceEpoch <= forMSecsSinceEpoch) {
          pQVar5 = pQVar5 + uVar11 + 1;
          uVar11 = ~uVar11 + uVar8;
        }
      }
      if (pQVar5 == pQVar3) {
        uVar9._0_4_ = (this->cached_data).m_preZoneRule.stdOffset;
        uVar9._4_4_ = (this->cached_data).m_preZoneRule.dstOffset;
        uVar6 = *(undefined4 *)&(this->cached_data).m_preZoneRule.abbreviationIndex;
      }
      else {
        pQVar4 = (this->cached_data).m_tranRules.d.ptr;
        pQVar1 = pQVar4 + pQVar5[-1].ruleIndex;
        uVar9._0_4_ = pQVar1->stdOffset;
        uVar9._4_4_ = pQVar1->dstOffset;
        uVar6 = *(undefined4 *)&pQVar4[pQVar5[-1].ruleIndex].abbreviationIndex;
      }
      rule._8_4_ = uVar6;
      rule.stdOffset = (int)uVar9;
      rule.dstOffset = (int)((ulong)uVar9 >> 0x20);
      dataFromRule(__return_storage_ptr__,this,rule,forMSecsSinceEpoch);
    }
  }
  else {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    getPosixTransitions((QList<QTimeZonePrivate::Data> *)&local_48,this,forMSecsSinceEpoch);
    pDVar10 = local_48.ptr;
    puVar7 = (undefined1 *)local_48.size;
    while (puVar12 = puVar7, 0 < (long)puVar12) {
      puVar7 = (undefined1 *)((ulong)puVar12 >> 1);
      if (pDVar10[(long)puVar7].atMSecsSinceEpoch <= forMSecsSinceEpoch) {
        pDVar10 = pDVar10 + (long)(puVar7 + 1);
        puVar7 = puVar12 + ~(ulong)puVar7;
      }
    }
    if (local_48.ptr < pDVar10) {
      *(undefined1 **)&__return_storage_ptr__->offsetFromUtc = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&__return_storage_ptr__->daylightTimeOffset = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      pDVar10 = pDVar10 + -1;
    }
    else {
      if (((this->cached_data).m_tranTimes.d.size != 0) || (local_48.ptr + local_48.size <= pDVar10)
         ) {
        QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
        goto LAB_003b379d;
      }
      *(undefined1 **)&__return_storage_ptr__->offsetFromUtc = &DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&__return_storage_ptr__->daylightTimeOffset = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      __return_storage_ptr__->atMSecsSinceEpoch = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->abbreviation).d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    }
    QTimeZonePrivate::Data::Data(__return_storage_ptr__,pDVar10);
    __return_storage_ptr__->atMSecsSinceEpoch = forMSecsSinceEpoch;
    QArrayDataPointer<QTimeZonePrivate::Data>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QTimeZonePrivate::Data QTzTimeZonePrivate::data(qint64 forMSecsSinceEpoch) const
{
    // If the required time is after the last transition (or there were none)
    // and we have a POSIX rule, then use it:
    if (!cached_data.m_posixRule.isEmpty()
        && (tranCache().isEmpty() || tranCache().last().atMSecsSinceEpoch < forMSecsSinceEpoch)) {
        QList<Data> posixTrans = getPosixTransitions(forMSecsSinceEpoch);
        auto it = std::partition_point(posixTrans.cbegin(), posixTrans.cend(),
                                       [forMSecsSinceEpoch] (const Data &at) {
                                           return at.atMSecsSinceEpoch <= forMSecsSinceEpoch;
                                       });
        // Use most recent, if any in the past; or the first if we have no other rules:
        if (it > posixTrans.cbegin() || (tranCache().isEmpty() && it < posixTrans.cend())) {
            Data data = *(it > posixTrans.cbegin() ? it - 1 : it);
            data.atMSecsSinceEpoch = forMSecsSinceEpoch;
            return data;
        }
    }
    if (tranCache().isEmpty()) // Only possible if !isValid()
        return {};

    // Otherwise, use the rule for the most recent or first transition:
    auto last = std::partition_point(tranCache().cbegin(), tranCache().cend(),
                                     [forMSecsSinceEpoch] (QTzTransitionTime at) {
                                         return at.atMSecsSinceEpoch <= forMSecsSinceEpoch;
                                     });
    if (last == tranCache().cbegin())
        return dataFromRule(cached_data.m_preZoneRule, forMSecsSinceEpoch);

    --last;
    return dataFromRule(cached_data.m_tranRules.at(last->ruleIndex), forMSecsSinceEpoch);
}